

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StuntDouble.hpp
# Opt level: O0

Vector3d * __thiscall OpenMD::StuntDouble::body2Lab(StuntDouble *this,Vector3d *v)

{
  Vector<double,_3U> *in_RDI;
  Vector<double,_3U> *this_00;
  Vector<double,_3U> *in_stack_ffffffffffffff40;
  RectMatrix<double,_3U,_3U> *in_stack_ffffffffffffff48;
  SnapshotManager *in_stack_ffffffffffffff58;
  
  this_00 = in_RDI;
  getA((StuntDouble *)&stack0xffffffffffffff40);
  SquareMatrix3<double>::transpose((SquareMatrix3<double> *)in_stack_ffffffffffffff58);
  OpenMD::operator*(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  Vector3<double>::Vector3((Vector3<double> *)this_00,in_RDI);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x333dec);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x333df6);
  return (Vector3d *)this_00;
}

Assistant:

Vector3d body2Lab(const Vector3d& v) { return getA().transpose() * v; }